

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_msg_internal_free2(void *m)

{
  long *plVar1;
  code *pcVar2;
  long lVar3;
  long lVar4;
  undefined4 local_78 [2];
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined1 local_30;
  
  LOCK();
  plVar1 = (long *)((long)m + 0x30);
  *plVar1 = *plVar1 + -1;
  UNLOCK();
  if (*plVar1 == 0) {
    if (*(long *)((long)m + 0x40) != 0) {
      lVar4 = *(long *)((long)m + 0x40);
      do {
        lVar3 = lVar4 + -1;
        *(long *)((long)m + 0x40) = lVar3;
        pcVar2 = *(code **)((long)m + lVar4 * 0x18 + 0x38);
        if (pcVar2 != (code *)0x0) {
          local_78[0] = 0;
          local_60 = *(undefined8 *)((long)m + 0x10);
          local_70 = *m;
          uStack_68 = *(undefined8 *)((long)m + 8);
          local_48 = *(undefined8 *)((long)m + 0x28);
          local_58 = *(undefined8 *)((long)m + 0x18);
          uStack_50 = *(undefined8 *)((long)m + 0x20);
          local_40 = 0;
          uStack_38 = 0;
          local_30 = 0;
          (*pcVar2)(local_78,*(undefined8 *)((long)m + lVar3 * 0x18 + 0x58));
          lVar3 = *(long *)((long)m + 0x40);
        }
        lVar4 = lVar3;
      } while (lVar3 != 0);
    }
    fio_free(m);
  }
  return;
}

Assistant:

static inline void fio_msg_internal_free(fio_msg_internal_s *m) {
  if (fio_atomic_sub(&m->ref, 1))
    return;
  while (m->meta_len) {
    --m->meta_len;
    if (m->meta[m->meta_len].on_finish) {
      fio_msg_s tmp_msg = {
          .channel = m->channel,
          .msg = m->data,
      };
      m->meta[m->meta_len].on_finish(&tmp_msg, m->meta[m->meta_len].metadata);
    }
  }
  fio_free(m);
}